

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O2

Arguments * __thiscall
Corrade::Utility::Arguments::setHelp(Arguments *this,string *key,string *help,string *helpKey)

{
  Type TVar1;
  Entry *pEVar2;
  ostream *poVar3;
  Debug *pDVar4;
  Error local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                 &this->_prefix,key);
  pEVar2 = find(this,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if (pEVar2 == (Entry *)0x0) {
    poVar3 = Error::defaultOutput();
    Error::Error(&local_98,poVar3,(Flags)0x0);
    pDVar4 = Debug::operator<<(&local_98.super_Debug,"Utility::Arguments::setHelp(): key");
    pDVar4 = Implementation::debugPrintStlString(pDVar4,key);
    Debug::operator<<(pDVar4,"not found");
LAB_001096ca:
    Error::~Error(&local_98);
    abort();
  }
  std::__cxx11::string::operator=((string *)&pEVar2->help,(string *)help);
  if (helpKey->_M_string_length != 0) {
    TVar1 = pEVar2->type;
    if (TVar1 - 2 < 3) {
      std::operator+(&local_50,&this->_prefix,key);
      std::operator+(&local_70,&local_50,' ');
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                     &local_70,helpKey);
      std::__cxx11::string::operator=((string *)&pEVar2->helpKey,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      if (ArrayArgument < TVar1) {
        if (TVar1 == BooleanOption) {
          poVar3 = Error::defaultOutput();
          Error::Error(&local_98,poVar3,(Flags)0x0);
          pDVar4 = Debug::operator<<(&local_98.super_Debug,
                                     "Utility::Arguments::setHelp(): help key can\'t be set for boolean option"
                                    );
          operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (pDVar4,key);
        }
        else {
          poVar3 = Error::defaultOutput();
          Error::Error(&local_98,poVar3,(Flags)0x0);
          Debug::operator<<(&local_98.super_Debug,
                            "Assertion found->type == Type::Argument || found->type == Type::ArrayArgument failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Arguments.cpp:468"
                           );
        }
        goto LAB_001096ca;
      }
      std::__cxx11::string::operator=((string *)&pEVar2->helpKey,(string *)helpKey);
    }
  }
  return this;
}

Assistant:

Arguments& Arguments::setHelp(const std::string& key, std::string help, std::string helpKey) {
    Entry* found = find(_prefix + key);
    CORRADE_ASSERT(found, "Utility::Arguments::setHelp(): key" << key << "not found", *this);

    found->help = std::move(help);

    if(!helpKey.empty()) {
        CORRADE_ASSERT(found->type != Type::BooleanOption,
            "Utility::Arguments::setHelp(): help key can't be set for boolean option" << key, *this);

        if(found->type == Type::NamedArgument || found->type == Type::Option || found->type == Type::ArrayOption)
            found->helpKey = _prefix + key + ' ' + std::move(helpKey);
        else {
            CORRADE_INTERNAL_ASSERT(found->type == Type::Argument || found->type == Type::ArrayArgument);
            found->helpKey = std::move(helpKey);
        }
    }

    return *this;
}